

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O0

ErrorNumber callAndProfile(char *funcName,ProfilingType type)

{
  TA_InputParameterType TVar1;
  TA_RetCode TVar2;
  clock_t cVar3;
  clock_t cVar4;
  undefined4 in_ESI;
  double dVar5;
  double worstProfiledCallLocal;
  double timeInProfiledCallLocal;
  int nbProfiledCallLocal;
  double clockDelta;
  clock_t endClock;
  clock_t startClock;
  int inputSize;
  int stepSize;
  int nbOuterLoop;
  int nbInnerLoop;
  int outNbElement;
  int outBegIdx;
  int k;
  int j;
  int i;
  int h;
  TA_RetCode retCode;
  TA_OutputParameterInfo *outputInfo;
  TA_InputParameterInfo *inputInfo;
  TA_FuncInfo *funcInfo;
  TA_FuncHandle *handle;
  TA_ParamHolder *paramHolder;
  TA_Real *local_108;
  TA_ParamHolder *in_stack_ffffffffffffff08;
  TA_FuncHandle **in_stack_ffffffffffffff10;
  TA_FuncHandle **in_stack_ffffffffffffff18;
  TA_ParamHolder *in_stack_ffffffffffffff20;
  TA_ParamHolder *in_stack_ffffffffffffff28;
  TA_Real *local_c8;
  TA_ParamHolder **in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  double local_a0;
  double local_98;
  int local_8c;
  int local_68;
  int local_64;
  int local_60;
  uint local_54;
  int local_50;
  uint local_4c;
  int local_48;
  TA_OutputParameterInfo *local_40;
  TA_InputParameterInfo *local_38;
  TA_FuncInfo *local_30;
  TA_FuncHandle *local_28;
  TA_ParamHolder *local_20;
  ErrorNumber local_4;
  
  local_8c = 0;
  local_98 = 0.0;
  local_a0 = 0.0;
  local_68 = 0;
  local_64 = 0;
  local_60 = 0;
  switch(in_ESI) {
  case 0:
    local_60 = 1;
    local_64 = 100;
    local_68 = 10000;
    break;
  case 1:
    local_60 = 2;
    local_64 = 0x32;
    local_68 = 2000;
    break;
  case 2:
    local_60 = 2;
    local_64 = 0x32;
    local_68 = 5000;
    break;
  case 3:
    local_60 = 5;
    local_64 = 0x14;
    local_68 = 2000;
    break;
  case 4:
    local_60 = 10;
    local_64 = 10;
    local_68 = 1000;
    break;
  case 5:
    local_60 = 0x14;
    local_64 = 5;
    local_68 = 500;
    break;
  case 6:
    local_60 = 100;
    local_64 = 1;
    local_68 = 100;
  }
  TVar2 = TA_GetFuncHandle((char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  if (TVar2 == TA_SUCCESS) {
    TVar2 = TA_ParamHolderAlloc((TA_FuncHandle *)
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                in_stack_ffffffffffffff40);
    if (TVar2 == TA_SUCCESS) {
      TA_GetFuncInfo(local_28,&local_30);
      for (local_4c = 0; (int)local_4c < (int)local_30->nbOutput; local_4c = local_4c + 1) {
        TA_GetOutputParameterInfo(local_28,local_4c,&local_40);
        if (local_40->type == TA_Output_Real) {
          TA_SetOutputParamRealPtr(local_20,local_4c,output[(int)local_4c]);
          for (local_50 = 0; local_50 < 2000; local_50 = local_50 + 1) {
            output[(int)local_4c][local_50] = -3e+37;
          }
        }
        else if (local_40->type == TA_Output_Integer) {
          TA_SetOutputParamIntegerPtr(local_20,local_4c,output_int[(int)local_4c]);
          for (local_50 = 0; local_50 < 2000; local_50 = local_50 + 1) {
            output_int[(int)local_4c][local_50] = -0x7fffffff;
          }
        }
      }
      for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
        for (local_4c = 0; (int)local_4c < local_64; local_4c = local_4c + 1) {
          for (local_50 = 0; local_50 < local_60; local_50 = local_50 + 1) {
            for (local_54 = 0; (int)local_54 < (int)local_30->nbInput; local_54 = local_54 + 1) {
              TA_GetInputParameterInfo(local_28,local_54,&local_38);
              TVar1 = local_38->type;
              if (TVar1 == TA_Input_Price) {
                if ((local_38->flags & 1U) == 0) {
                  local_c8 = (TA_Real *)0x0;
                }
                else {
                  local_c8 = gDataOpen + local_50 * local_68;
                }
                if ((local_38->flags & 2U) == 0) {
                  in_stack_ffffffffffffff20 = (TA_ParamHolder *)0x0;
                }
                else {
                  in_stack_ffffffffffffff20 = (TA_ParamHolder *)(gDataHigh + local_50 * local_68);
                }
                if ((local_38->flags & 4U) == 0) {
                  in_stack_ffffffffffffff10 = (TA_FuncHandle **)0x0;
                }
                else {
                  in_stack_ffffffffffffff10 = (TA_FuncHandle **)(gDataLow + local_50 * local_68);
                }
                if ((local_38->flags & 8U) == 0) {
                  in_stack_ffffffffffffff08 = (TA_ParamHolder *)0x0;
                }
                else {
                  in_stack_ffffffffffffff08 = (TA_ParamHolder *)(gDataClose + local_50 * local_68);
                }
                if ((local_38->flags & 0x10U) == 0) {
                  local_108 = (TA_Real *)0x0;
                }
                else {
                  local_108 = gDataClose + local_50 * local_68;
                }
                in_stack_ffffffffffffff18 = in_stack_ffffffffffffff10;
                in_stack_ffffffffffffff28 = in_stack_ffffffffffffff20;
                TA_SetInputParamPricePtr
                          (local_20,local_54,local_c8,(TA_Real *)in_stack_ffffffffffffff20,
                           (TA_Real *)in_stack_ffffffffffffff10,(TA_Real *)in_stack_ffffffffffffff08
                           ,local_108,(TA_Real *)0x0);
              }
              else if (TVar1 == TA_Input_Real) {
                TA_SetInputParamRealPtr(local_20,local_54,gDataClose + local_50 * local_68);
              }
              else if (TVar1 == TA_Input_Integer) {
                printf("\nError: Integer input not yet supported for profiling.\n");
                return TA_ABS_TST_FAIL_CALLFUNC_1;
              }
            }
            cVar3 = clock();
            TVar2 = TA_CallFunc(in_stack_ffffffffffffff28,
                                (TA_Integer)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                (TA_Integer)in_stack_ffffffffffffff20,
                                (TA_Integer *)in_stack_ffffffffffffff18,
                                (TA_Integer *)in_stack_ffffffffffffff10);
            if (TVar2 != TA_SUCCESS) {
              printf("TA_CallFunc() failed zero data test [%d]\n",(ulong)TVar2);
              TA_ParamHolderFree(in_stack_ffffffffffffff08);
              return TA_ABS_TST_FAIL_CALLFUNC_1;
            }
            cVar4 = clock();
            dVar5 = (double)(cVar4 - cVar3);
            if (dVar5 <= 0.0) {
              printf(
                    "Error: Insufficient timer precision to perform benchmarking on this platform.\n"
                    );
              return TA_ABS_TST_FAIL_CALLFUNC_1;
            }
            if (worstProfiledCall < dVar5) {
              worstProfiledCall = dVar5;
            }
            timeInProfiledCall = dVar5 + timeInProfiledCall;
            nbProfiledCall = nbProfiledCall + 1;
            if (local_a0 < dVar5) {
              local_a0 = dVar5;
            }
            local_98 = dVar5 + local_98;
            local_8c = local_8c + 1;
          }
        }
      }
      printf("%g ",(local_98 - local_a0) / (double)(local_8c + -1));
      TVar2 = TA_ParamHolderFree(in_stack_ffffffffffffff08);
      if (TVar2 == TA_SUCCESS) {
        local_4 = TA_TEST_PASS;
      }
      else {
        printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar2);
        local_4 = TA_ABS_TST_FAIL_PARAMHOLDERFREE;
      }
    }
    else {
      printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar2);
      local_4 = TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
    }
  }
  else {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar2);
    local_4 = TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  return local_4;
}

Assistant:

static ErrorNumber callAndProfile( const char *funcName, ProfilingType type )
{
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   const TA_FuncInfo *funcInfo;
   const TA_InputParameterInfo *inputInfo;
   const TA_OutputParameterInfo *outputInfo;

   TA_RetCode retCode;
   int h, i, j, k;
   int outBegIdx, outNbElement;

   /* Variables to control iteration and corresponding input size */
   int nbInnerLoop, nbOuterLoop;
   int stepSize;
   int inputSize;

   /* Variables measuring the execution time */
#ifdef WIN32
   LARGE_INTEGER startClock;
   LARGE_INTEGER endClock;
#else
   clock_t startClock;
   clock_t endClock;
#endif
   double clockDelta;
   int nbProfiledCallLocal;
   double timeInProfiledCallLocal;
   double worstProfiledCallLocal;

   nbProfiledCallLocal = 0;
   timeInProfiledCallLocal = 0.0;
   worstProfiledCallLocal = 0.0;
   nbInnerLoop = nbOuterLoop = stepSize = inputSize = 0;

   switch( type )
   {
   case PROFILING_10000:
	   nbInnerLoop = 1;
	   nbOuterLoop = 100;
	   stepSize = 10000;
	   inputSize = 10000;
	   break;
   case PROFILING_8000:
	   nbInnerLoop = 2;
	   nbOuterLoop = 50;
	   stepSize = 2000;
	   inputSize = 8000;
       break;
   case PROFILING_5000:
	   nbInnerLoop = 2;
	   nbOuterLoop = 50;
	   stepSize = 5000;
	   inputSize = 5000;
	   break;
   case PROFILING_2000:
	   nbInnerLoop = 5;
	   nbOuterLoop = 20;
	   stepSize = 2000;
	   inputSize = 2000;
	   break;
   case PROFILING_1000:
	   nbInnerLoop = 10;
	   nbOuterLoop = 10;
	   stepSize = 1000;
	   inputSize = 1000;
	   break;
   case PROFILING_500:
	   nbInnerLoop = 20;
	   nbOuterLoop = 5;
	   stepSize = 500;
	   inputSize = 500;
	   break;
   case PROFILING_100:
	   nbInnerLoop = 100;
	   nbOuterLoop = 1;
	   stepSize = 100;
	   inputSize = 100;
	   break;
   }

   retCode = TA_GetFuncHandle( funcName, &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   TA_GetFuncInfo( handle, &funcInfo );

   for( i=0; i < (int)funcInfo->nbOutput; i++ )
   {
      TA_GetOutputParameterInfo( handle, i, &outputInfo );
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
	     TA_SetOutputParamRealPtr(paramHolder,i,&output[i][0]);
         for( j=0; j < 2000; j++ )
            output[i][j] = TA_REAL_MIN;
		 break;
	  case TA_Output_Integer:
	     TA_SetOutputParamIntegerPtr(paramHolder,i,&output_int[i][0]);
         for( j=0; j < 2000; j++ )
            output_int[i][j] = TA_INTEGER_MIN;
		 break;
	  }
   }

   for( h=0; h < 2; h++ )
   {
   for( i=0; i < nbOuterLoop; i++ )
   {
	   for( j=0; j < nbInnerLoop; j++ )
	   {
		   /* Prepare input. */
		   for( k=0; k < (int)funcInfo->nbInput; k++ )
		   {
			  TA_GetInputParameterInfo( handle, k, &inputInfo );
			  switch(inputInfo->type)
			  {
			  case TA_Input_Price:
				 TA_SetInputParamPricePtr( paramHolder, k,
					 inputInfo->flags&TA_IN_PRICE_OPEN?&gDataOpen[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_HIGH?&gDataHigh[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_LOW?&gDataLow[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_CLOSE?&gDataClose[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_VOLUME?&gDataClose[j*stepSize]:NULL, NULL );
				 break;
			  case TA_Input_Real:
				 TA_SetInputParamRealPtr( paramHolder, k, &gDataClose[j*stepSize] );
				 break;
			  case TA_Input_Integer:
				 printf( "\nError: Integer input not yet supported for profiling.\n" );
				 return TA_ABS_TST_FAIL_CALLFUNC_1;
			  }
		   }

           #ifdef WIN32
              QueryPerformanceCounter(&startClock);
           #else
              startClock = clock();
           #endif

		   /* Do the function call. */
		   retCode = TA_CallFunc(paramHolder,0,inputSize-1,&outBegIdx,&outNbElement);
		   if( retCode != TA_SUCCESS )
		   {
		      printf( "TA_CallFunc() failed zero data test [%d]\n", retCode );
		      TA_ParamHolderFree( paramHolder );
		      return TA_ABS_TST_FAIL_CALLFUNC_1;
		   }

		   #ifdef WIN32
			   QueryPerformanceCounter(&endClock);
			   clockDelta = (double)((__int64)endClock.QuadPart - (__int64) startClock.QuadPart);
		   #else
			   endClock = clock();
			   clockDelta = (double)(endClock - startClock);
		   #endif

		   /* Setup global profiling info. */
		   if( clockDelta <= 0 )
		   {
			   printf( "Error: Insufficient timer precision to perform benchmarking on this platform.\n" );
			   return TA_ABS_TST_FAIL_CALLFUNC_1;
		   }
		   else
		   {
			   if( clockDelta > worstProfiledCall )
			      worstProfiledCall = clockDelta;
			   timeInProfiledCall += clockDelta;
			   nbProfiledCall++;
		   }

		   /* Setup local profiling info for this particular function. */
		   if( clockDelta > worstProfiledCallLocal )
			   worstProfiledCallLocal = clockDelta;
		   timeInProfiledCallLocal += clockDelta;
		   nbProfiledCallLocal++;
	   }
   }
   }

   /* Output statistic (remove worst call, average the others. */
   printf( "%g ", (timeInProfiledCallLocal-worstProfiledCallLocal)/(double)(nbProfiledCallLocal-1));

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   return TA_TEST_PASS;
}